

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

type __thiscall
fmt::v5::internal::printf_width_handler<char>::operator()
          (printf_width_handler<char> *this,longlong value)

{
  format_error *this_00;
  
  if (value < 0) {
    (this->spec_->super_align_spec).align_ = ALIGN_LEFT;
    value = -value;
  }
  if ((ulong)value >> 0x1f == 0) {
    return (type)value;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"number is too big");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline format_arg_store<wprintf_context, Args...>
  make_wprintf_args(const Args &... args) { return {args...}; }